

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O0

void png_convert_from_time_t(png_timep ptime,time_t ttime)

{
  tm *ttime_00;
  tm *tbuf;
  time_t ttime_local;
  png_timep ptime_local;
  
  tbuf = (tm *)ttime;
  ttime_local = (time_t)ptime;
  ttime_00 = (tm *)gmtime((time_t *)&tbuf);
  png_convert_from_struct_tm((png_timep)ttime_local,ttime_00);
  return;
}

Assistant:

void PNGAPI
png_convert_from_time_t(png_timep ptime, time_t ttime)
{
   struct tm *tbuf;

   png_debug(1, "in png_convert_from_time_t");

   tbuf = gmtime(&ttime);
   png_convert_from_struct_tm(ptime, tbuf);
}